

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_math.c
# Opt level: O2

size_t ares_count_hexdigits(size_t n)

{
  size_t digits;
  
  digits = 0;
  for (; n != 0; n = n >> 4) {
    digits = digits + 1;
  }
  return digits + (digits == 0);
}

Assistant:

size_t ares_count_hexdigits(size_t n)
{
  size_t digits;

  for (digits = 0; n > 0; digits++) {
    n /= 16;
  }
  if (digits == 0) {
    digits = 1;
  }

  return digits;
}